

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlwrap.c
# Opt level: O0

void * dlwrap_real_dlsym(void *handle,char *name)

{
  void *pvVar1;
  int local_50;
  int i;
  int num_versions;
  char *version [5];
  char *name_local;
  void *handle_local;
  
  if (dlwrap_real_dlsym::real_dlsym == (fips_dlsym_t)0x0) {
    memcpy(&i,&PTR_anon_var_dwarf_bde_00104d10,0x28);
    local_50 = 0;
    while ((local_50 < 5 &&
           (dlwrap_real_dlsym::real_dlsym =
                 (fips_dlsym_t)
                 dlvsym(0xffffffffffffffff,"dlsym",*(undefined8 *)(&i + (long)local_50 * 2)),
           dlwrap_real_dlsym::real_dlsym == (fips_dlsym_t)0x0))) {
      local_50 = local_50 + 1;
    }
    if (local_50 == 5) {
      fprintf(_stderr,"Internal error: Failed to find real dlsym\n");
      fprintf(_stderr,
              "This may be a simple matter of fips not knowing about the version of GLIBC that\nyour program is using. Current known versions are:\n\n\t"
             );
      for (local_50 = 0; local_50 < 5; local_50 = local_50 + 1) {
        fprintf(_stderr,"%s ",*(undefined8 *)(&i + (long)local_50 * 2));
      }
      fprintf(_stderr,
              "\n\nYou can inspect your version by first finding libdl.so.2:\n\n\tldd <your-program> | grep libdl.so\n\nAnd then inspecting the version attached to the dlsym symbol:\n\n\treadelf -s /path/to/libdl.so.2 | grep dlsym\n\nAnd finally, adding the version to dlwrap.c:dlwrap_real_dlsym.\n"
             );
      exit(1);
    }
  }
  pvVar1 = (*dlwrap_real_dlsym::real_dlsym)(handle,name);
  return pvVar1;
}

Assistant:

void *
dlwrap_real_dlsym(void *handle, const char *name)
{
    static fips_dlsym_t real_dlsym = NULL;

    if (!real_dlsym) {
        /* FIXME: This brute-force, hard-coded searching for a versioned
         * symbol is really ugly. The only reason I'm doing this is because
         * I need some way to lookup the "dlsym" function in libdl, but
         * I can't use 'dlsym' to do it. So dlvsym works, but forces me
         * to guess what the right version is.
         *
         * Potential fixes here:
         *
         *   1. Use libelf to actually inspect libdl.so and
         *      find the right version, (finding the right
         *      libdl.so can be made easier with
         *      dl_iterate_phdr).
         *
         *   2. Use libelf to find the offset of the 'dlsym'
         *      symbol within libdl.so, (and then add this to
         *      the base address at which libdl.so is loaded
         *      as reported by dl_iterate_phdr).
         *
         * In the meantime, I'll just keep augmenting this
         * hard-coded version list as people report bugs. */
        const char *version[] = {
            "GLIBC_2.4",
            "GLIBC_2.3",
            "GLIBC_2.2.5",
            "GLIBC_2.2",
            "GLIBC_2.0"
        };
        int num_versions = sizeof(version) / sizeof(version[0]);
        int i;
        for (i = 0; i < num_versions; i++) {
            real_dlsym = (fips_dlsym_t) dlvsym(RTLD_NEXT, "dlsym", version[i]);
            if (real_dlsym)
                break;
        }
        if (i == num_versions) {
            fprintf(stderr, "Internal error: Failed to find real dlsym\n");
            fprintf(stderr,
                    "This may be a simple matter of fips not knowing about the version of GLIBC that\n"
                    "your program is using. Current known versions are:\n\n\t");
            for (i = 0; i < num_versions; i++)
                fprintf(stderr, "%s ", version[i]);
            fprintf(stderr,
                    "\n\nYou can inspect your version by first finding libdl.so.2:\n"
                    "\n"
                    "\tldd <your-program> | grep libdl.so\n"
                    "\n"
                    "And then inspecting the version attached to the dlsym symbol:\n"
                    "\n"
                    "\treadelf -s /path/to/libdl.so.2 | grep dlsym\n"
                    "\n"
                    "And finally, adding the version to dlwrap.c:dlwrap_real_dlsym.\n");

            exit(1);
        }
    }

    return real_dlsym(handle, name);
}